

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3unas.cpp
# Opt level: O2

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src,CTcUnasOut *out,char ch_op)

{
  ushort uVar1;
  undefined2 uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar6;
  undefined4 extraout_var_07;
  long lVar7;
  undefined4 uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  bool bVar16;
  char ch [10];
  char name [128];
  byte local_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 local_d0;
  undefined2 local_cf;
  CTcUnasOut *local_c8;
  uint local_c0;
  uint local_bc;
  char local_b8 [136];
  undefined4 extraout_var_06;
  
  (*src->_vptr_CTcUnasSrc[3])();
  uVar13 = (ulong)(byte)ch_op;
  iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
  local_c8 = out;
  (**(code **)(*(long *)out + 0x10))
            (out,"%8lx  %-14.14s ",CONCAT44(extraout_var,iVar4) + -1,instr_info[uVar13].nm);
  iVar4 = (int)CONCAT71(in_register_00000011,ch_op);
  if (iVar4 == -0x70) {
    (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
    (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
    uVar10 = (uint)CONCAT11(uStack_d3,local_d4);
    (**(code **)(*(long *)local_c8 + 0x10))(local_c8,"0x%x\n",uVar10);
    while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
      iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
      (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
      (*src->_vptr_CTcUnasSrc[2])(src,&local_d0);
      (*src->_vptr_CTcUnasSrc[2])(src,&local_cf);
      (*src->_vptr_CTcUnasSrc[2])(src,(long)&local_cf + 1);
      iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
      if (CONCAT44(extraout_var_01,iVar5) == CONCAT44(extraout_var_00,iVar4)) break;
      pcVar14 = "nil";
      pcVar12 = "";
      switch(local_d4) {
      case 1:
        break;
      case 2:
        pcVar14 = "true";
        pcVar12 = "";
        break;
      default:
        pcVar12 = "???";
        pcVar14 = "???";
        break;
      case 5:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%08lx",
                (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
        pcVar14 = "object";
        break;
      case 6:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%04x",(ulong)CONCAT11(uStack_d2,uStack_d3));
        pcVar14 = "prop";
        break;
      case 7:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%08lx",
                (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
        pcVar14 = "int";
        break;
      case 8:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%08lx",
                (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
        pcVar14 = "sstring";
        break;
      case 10:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%08lx",
                (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
        pcVar14 = "list";
        break;
      case 0xc:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%08lx",
                (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
        pcVar14 = "funcptr";
        break;
      case 0xf:
        pcVar12 = local_b8;
        sprintf(pcVar12,"0x%08lx",
                (ulong)CONCAT13(local_d0,CONCAT12(uStack_d1,CONCAT11(uStack_d2,uStack_d3))));
        pcVar14 = "enum";
      }
      iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
      sVar3 = local_cf;
      iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
      (**(code **)(*(long *)local_c8 + 0x10))
                (local_c8,"          0x%08lx      %-8.8s(%-10.10s) -> +0x%04lx (0x%08lx)\n",
                 CONCAT44(extraout_var_02,iVar4) + -7,pcVar14,pcVar12,sVar3,
                 CONCAT44(extraout_var_03,iVar5) + (long)local_cf + -2);
    }
    (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
    (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
    iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
    uVar2 = CONCAT11(uStack_d3,local_d4);
    iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
    (**(code **)(*(long *)local_c8 + 0x10))
              (local_c8,"          0x%08lx      default              -> +0x%04lx (0x%08lx)\n",
               CONCAT44(extraout_var_04,iVar4) + -2,uVar2,
               CONCAT44(extraout_var_05,iVar5) + (long)CONCAT11(uStack_d3,local_d4) + -2);
  }
  else {
    if (iVar4 == 0x57) {
      (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
      (**(code **)(*(long *)local_c8 + 0x10))
                (local_c8,"len=0x%x, cnt=0x%x [",CONCAT11(uStack_d3,local_d4),local_d4);
      local_c0 = (uint)local_d4;
      for (uVar10 = 0; pcVar12 = local_b8, uVar10 != local_c0; uVar10 = uVar10 + 1) {
        local_bc = uVar10;
        (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
        uVar1 = CONCAT11(uStack_d3,local_d4);
        uVar13 = 0x80;
        if (uVar1 < 0x80) {
          uVar13 = (ulong)(uint)uVar1;
        }
        iVar4 = (int)uVar13 * 2 - (uint)uVar1;
        uVar11 = uVar13;
        while (uVar10 = local_bc, bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
          (*src->_vptr_CTcUnasSrc[2])(src,pcVar12);
          pcVar12 = pcVar12 + 1;
          iVar4 = iVar4 + -1;
        }
        pcVar12 = ", ";
        if (local_bc == 0) {
          pcVar12 = ":";
        }
        (**(code **)(*(long *)local_c8 + 0x10))(local_c8,"%s%.*s",pcVar12,uVar13,local_b8);
        for (; iVar4 != 0; iVar4 = iVar4 + 1) {
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
        }
      }
      lVar15 = *(long *)local_c8;
      pcVar12 = "]";
    }
    else {
      for (lVar15 = 0; lVar15 < instr_info[uVar13].op_cnt; lVar15 = lVar15 + 1) {
        if (lVar15 != 0) {
          (**(code **)(*(long *)local_c8 + 0x10))(local_c8,", ");
        }
        switch(*(undefined4 *)(uVar13 * 0x18 + 0x3740dc + lVar15 * 4)) {
        case 0:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          uVar10 = (uint)(char)local_d4;
          goto LAB_00247701;
        case 1:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          uVar10 = (uint)local_d4;
          goto LAB_00247701;
        case 2:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          uVar10 = (uint)CONCAT11(uStack_d3,local_d4);
          goto LAB_00247701;
        case 3:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          uVar10 = (uint)CONCAT11(uStack_d3,local_d4);
LAB_00247701:
          lVar7 = *(long *)local_c8;
          pcVar12 = "0x%x";
LAB_00247710:
          (**(code **)(lVar7 + 0x10))(local_c8,pcVar12,uVar10);
          goto LAB_0024783b;
        case 4:
        case 5:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
          uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
          lVar7 = *(long *)local_c8;
          pcVar12 = "0x%lx";
          break;
        case 6:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
          uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
          lVar7 = *(long *)local_c8;
          pcVar12 = "string(0x%lx)";
          break;
        case 7:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
          uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
          lVar7 = *(long *)local_c8;
          pcVar12 = "list(0x%lx)";
          break;
        case 8:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
          uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
          lVar7 = *(long *)local_c8;
          pcVar12 = "code(0x%08lx)";
          break;
        case 9:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          sVar3 = CONCAT11(uStack_d3,local_d4);
          uVar11 = (ulong)sVar3;
          if ((long)uVar11 < 0) {
            iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
            lVar6 = CONCAT44(extraout_var_07,iVar4);
            lVar7 = *(long *)local_c8;
            pcVar12 = "-0x%04x (0x%08lx)";
            uVar9 = (ulong)(uint)-(int)sVar3;
          }
          else {
            iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
            lVar6 = CONCAT44(extraout_var_06,iVar4);
            lVar7 = *(long *)local_c8;
            pcVar12 = "+0x%04x (0x%08lx)";
            uVar9 = uVar11 & 0xffffffff;
          }
          (**(code **)(lVar7 + 0x10))(local_c8,pcVar12,uVar9,lVar6 + uVar11 + -2);
          goto LAB_0024783b;
        case 10:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
          uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
          lVar7 = *(long *)local_c8;
          pcVar12 = "object(0x%lx)";
          break;
        case 0xb:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          uVar10 = (uint)CONCAT11(uStack_d3,local_d4);
          lVar7 = *(long *)local_c8;
          pcVar12 = "property(0x%x)";
          goto LAB_00247710;
        case 0xc:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d2);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d1);
          uVar8 = CONCAT13(uStack_d1,CONCAT12(uStack_d2,CONCAT11(uStack_d3,local_d4)));
          lVar7 = *(long *)local_c8;
          pcVar12 = "enum(0x%lx)";
          break;
        case 0xd:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          if (local_d4 == 3) {
            lVar7 = *(long *)local_c8;
            pcVar12 = "definingobj";
          }
          else if (local_d4 == 2) {
            lVar7 = *(long *)local_c8;
            pcVar12 = "targetobj";
          }
          else {
            if (local_d4 != 1) {
              uVar10 = (uint)(char)local_d4;
              goto LAB_00247701;
            }
            lVar7 = *(long *)local_c8;
            pcVar12 = "targetprop";
          }
          goto LAB_00247668;
        case 0xe:
          (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d3);
          (**(code **)(*(long *)local_c8 + 0x10))(local_c8,"string(inline)");
          uVar11 = (ulong)CONCAT11(uStack_d3,local_d4);
          while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
            (*src->_vptr_CTcUnasSrc[2])(src,&local_d4);
          }
          goto LAB_0024783b;
        default:
          lVar7 = *(long *)local_c8;
          pcVar12 = "...unknown type...";
LAB_00247668:
          (**(code **)(lVar7 + 0x10))(local_c8,pcVar12);
          goto LAB_0024783b;
        }
        (**(code **)(lVar7 + 0x10))(local_c8,pcVar12,uVar8);
LAB_0024783b:
      }
      lVar15 = *(long *)local_c8;
      pcVar12 = "\n";
    }
    (**(code **)(lVar15 + 0x10))(local_c8,pcVar12);
  }
  return;
}

Assistant:

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src, CTcUnasOut *out, char ch_op)
{
    t3_instr_info_t *info;
    int i;
    ulong acc;
    char ch[10];
    ulong prv_ofs = src->get_ofs();
    
    /* get the information on this instruction */
    info = &instr_info[(int)(uchar)ch_op];
    out->print("%8lx  %-14.14s ", src->get_ofs() - 1, info->nm);

    /* check the instruction type */
    switch((uchar)ch_op)
    {
    case OPC_SWITCH:
        /* 
         *   It's a switch instruction - special handling is required,
         *   since this instruction doesn't fit any of the normal
         *   patterns.  First, get the number of elements in the case
         *   table - this is a UINT2 value at the start of the table.  
         */
        src->next_byte(ch);
        src->next_byte(ch+1);
        acc = osrp2(ch);

        /* display the count */
        out->print("0x%x\n", (uint)acc);

        /* display the table */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            const char *dt;
            char valbuf[128];
            const char *val = valbuf;

            /* note the current offset */
            prv_ofs = src->get_ofs();
            
            /* read the DATAHOLDER value */
            src->next_byte(ch);
            src->next_byte(ch+1);
            src->next_byte(ch+2);
            src->next_byte(ch+3);
            src->next_byte(ch+4);

            /* read the jump offset */
            src->next_byte(ch+5);
            src->next_byte(ch+6);

            /* 
             *   stop looping if the offset hasn't changed - this probably
             *   means we're stuck trying to interpret as a "switch" some
             *   data at the end of the stream that happens to look like a
             *   switch but really isn't (such as an exception table, or
             *   debug records) 
             */
            if (src->get_ofs() == prv_ofs)
                break;

            /* show the value */
            switch(ch[0])
            {
            case VM_NIL:
                dt = "nil";
                val = "";
                break;
                
            case VM_TRUE:
                dt = "true";
                val = "";
                break;
                
            case VM_OBJ:
                dt = "object";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_PROP:
                dt = "prop";
                sprintf(valbuf, "0x%04x", osrp2(ch+1));
                break;
                
            case VM_INT:
                dt = "int";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            case VM_ENUM:
                dt = "enum";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_SSTRING:
                dt = "sstring";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_LIST:
                dt = "list";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_FUNCPTR:
                dt = "funcptr";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            default:
                dt = "???";
                val = "???";
                break;
            }

            /* show the slot data */
            out->print("          0x%08lx      %-8.8s(%-10.10s) "
                       "-> +0x%04lx (0x%08lx)\n",
                       src->get_ofs() - 7, dt, val, osrp2(ch+5),
                       src->get_ofs() - 2 + osrp2s(ch+5));
        }

        /* read and show the 'default' jump offset */
        src->next_byte(ch);
        src->next_byte(ch+1);
        out->print("          0x%08lx      default              "
                   "-> +0x%04lx (0x%08lx)\n",
                   src->get_ofs() - 2, osrp2(ch),
                   src->get_ofs() - 2 + osrp2s(ch));

        /* done */
        break;

    case OPC_NAMEDARGTAB:
        /* named argument table */
        src->next_byte(ch);
        src->next_byte(ch+1);
        src->next_byte(ch+2);
        acc = osrp2(ch);
        out->print("len=0x%x, cnt=0x%x [", (uint)acc, (uint)(uchar)*ch);
        acc = (uchar)*ch;

        /* show the names */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            /* get the length */
            src->next_byte(ch);
            src->next_byte(ch);
            uint len = osrp2(ch);

            /* get the name */
            char name[128];
            uint j;
            for (j = 0 ; j < len && j < sizeof(name) ; ++j)
                src->next_byte(name + j);

            /* show the name */
            out->print("%s%.*s", i > 0 ? ", " : ":", (int)j, name);

            /* skip any excess portion of the name */
            for ( ; j < len ; ++j)
                src->next_byte(ch);
        }

        /* end the list, and we're done */
        out->print("]");
        break;

    default:
        /* show all parameters */
        for (i = 0 ; i < info->op_cnt ; ++i)
        {
            /* add a separator if this isn't the first one */
            if (i != 0)
                out->print(", ");
            
            /* display the operand */
            switch(info->op_type[i])
            {
            case T3OP_TYPE_8S:
                /* 8-bit signed integer */
                src->next_byte(ch);
                out->print("0x%x", (int)ch[0]);
                break;

            case T3OP_TYPE_8U:
                /* 8-bit unsigned integer */
                src->next_byte(ch);
                out->print("0x%x", (uint)(uchar)ch[0]);
                break;

            case T3OP_TYPE_16S:
                /* 16-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                out->print("0x%x", (int)acc);
                break;

            case T3OP_TYPE_16U:
                /* 16-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("0x%x", (uint)acc);
                break;

            case T3OP_TYPE_32S:
                /* 32-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_32U:
                /* 32-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_STR:
                /* string offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("string(0x%lx)", acc);
                break;

            case T3OP_TYPE_LIST:
                /* list offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("list(0x%lx)", acc);
                break;

            case T3OP_TYPE_CODE_ABS:
                /* 32-bit absolute code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("code(0x%08lx)", acc);
                break;

            case T3OP_TYPE_CODE_REL:
                /* 16-bit relative code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                if ((long)acc < 0)
                    out->print("-0x%04x (0x%08lx)",
                               -(int)acc, src->get_ofs() - 2 + acc);
                else
                    out->print("+0x%04x (0x%08lx)",
                               (int)acc, src->get_ofs() - 2 + acc);
                break;

            case T3OP_TYPE_OBJ:
                /* object ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("object(0x%lx)", acc);
                break;

            case T3OP_TYPE_PROP:
                /* property ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("property(0x%x)", (uint)acc);
                break;

            case T3OP_TYPE_ENUM:
                /* enum */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("enum(0x%lx)", acc);
                break;

            case T3OP_TYPE_CTX_ELE:
                /* context element identifier */
                src->next_byte(ch);
                switch(ch[0])
                {
                case PUSHCTXELE_TARGPROP:
                    out->print("targetprop");
                    break;

                case PUSHCTXELE_TARGOBJ:
                    out->print("targetobj");
                    break;

                case PUSHCTXELE_DEFOBJ:
                    out->print("definingobj");
                    break;

                default:
                    out->print("0x%x", (int)ch[0]);
                    break;
                }
                break;

            case T3OP_TYPE_INLINE_STR:
                /* get the string length */
                src->next_byte(ch);
                src->next_byte(ch+1);

                /* show it */
                out->print("string(inline)");

                /* skip the string */
                for (acc = osrp2(ch) ; acc != 0 ; --acc)
                    src->next_byte(ch);

                /* done */
                break;

            default:
                out->print("...unknown type...");
                break;
            }
        }

        /* end the line */
        out->print("\n");
    }
}